

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

string * __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::toString
          (string *__return_storage_ptr__,
          Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  int i;
  allocator local_1a;
  undefined1 local_19;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_18;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  string *output;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  if (this->vertexCount == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[]\n");
  }
  else {
    for (local_30 = 0; local_30 < this->vertexCount; local_30 = local_30 + 1) {
      GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::toString(&local_70,this->vertexList + local_30);
      std::operator+(&local_50,&local_70," -> ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::toString(&local_b0,this->adjacencyList + local_30);
      std::operator+(&local_90,&local_b0,"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Graph<T>::toString()
{
  std::string output = "";
  if(vertexCount == 0)
  {
    output += "[]\n";
  }

  else
  {
    for(int i = 0; i < vertexCount; i++)
    {
      output += vertexList[i].toString() +" -> "; // Region/ Zone

      output += adjacencyList[i].toString() + "\n"; // Connected regions and zones
    }
  }

  return output;
}